

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

int __thiscall
CVmObjDict::del_hash_entry
          (CVmObjDict *this,char *str,size_t len,vm_obj_id_t obj,vm_prop_id_t voc_prop)

{
  CVmHashEntry *this_00;
  vm_dict_ext *pvVar1;
  undefined4 in_ECX;
  undefined8 in_RDX;
  CVmHashTable *in_RSI;
  CVmHashEntryDict *in_RDI;
  undefined2 in_R8W;
  CVmHashEntryDict *entry;
  size_t in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd8;
  CVmHashEntryDict *this_01;
  int local_4;
  
  this_01 = in_RDI;
  get_ext((CVmObjDict *)in_RDI);
  this_00 = CVmHashTable::find((CVmHashTable *)
                               CONCAT44(in_ECX,CONCAT22(in_R8W,in_stack_ffffffffffffffd8)),
                               in_stack_ffffffffffffffd0,(size_t)in_RDI);
  if (this_00 == (CVmHashEntry *)0x0) {
    local_4 = 0;
  }
  else {
    pvVar1 = get_ext((CVmObjDict *)in_RDI);
    if (pvVar1->trie_ != (vmdict_TrieNode *)0x0) {
      get_ext((CVmObjDict *)in_RDI);
      vmdict_TrieNode::del_word((vmdict_TrieNode *)this_00,(char *)in_RDI,in_stack_ffffffffffffffc0)
      ;
    }
    get_ext((CVmObjDict *)in_RDI);
    local_4 = CVmHashEntryDict::del_entry
                        (this_01,in_RSI,(vm_obj_id_t)((ulong)in_RDX >> 0x20),
                         (vm_prop_id_t)((ulong)in_RDX >> 0x10));
  }
  return local_4;
}

Assistant:

int CVmObjDict::del_hash_entry(VMG_ const char *str, size_t len,
                               vm_obj_id_t obj, vm_prop_id_t voc_prop)
{
    CVmHashEntryDict *entry;

    /* find the hash table entry for the word */
    entry = (CVmHashEntryDict *)get_ext()->hashtab_->find(str, len);

    /* if we found it, delete the obj/prop entry */
    if (entry != 0)
    {
        /* if we have a trie, delete the trie entry */
        if (get_ext()->trie_ != 0)
            get_ext()->trie_->del_word(str, len);
        
        /* delete the hash table entry */
        return entry->del_entry(get_ext()->hashtab_, obj, voc_prop);
    }

    /* we didn't find anything to delete */
    return FALSE;
}